

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O3

void __thiscall kratos::Generator::Generator(Generator *this,Context *context,string *name)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  bool bVar3;
  UserException *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  format_args args;
  pointer local_128;
  size_type sStack_120;
  string local_110;
  string *local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  
  (this->super_enable_shared_from_this<kratos::Generator>)._M_weak_this.
  super___weak_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<kratos::Generator>)._M_weak_this.
  super___weak_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_IRNode).fn_name_ln.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_IRNode).fn_name_ln.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->super_IRNode).fn_name_ln.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->super_IRNode).fn_name_ln.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->super_IRNode).comment._M_dataplus._M_p = (pointer)&(this->super_IRNode).comment.field_2;
  (this->super_IRNode).comment._M_string_length = 0;
  (this->super_IRNode).comment.field_2._M_local_buf[0] = '\0';
  (this->super_IRNode).ast_node_type_ = GeneratorKind;
  (this->super_IRNode).attributes_.
  super__Vector_base<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_IRNode).attributes_.
  super__Vector_base<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_IRNode).attributes_.
  super__Vector_base<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_IRNode)._vptr_IRNode = (_func_int **)&PTR_accept_002c8410;
  local_48 = &(this->name).field_2;
  (this->name)._M_dataplus._M_p = (pointer)local_48;
  pcVar2 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name,pcVar2,pcVar2 + name->_M_string_length);
  local_40 = &(this->instance_name).field_2;
  (this->instance_name)._M_dataplus._M_p = (pointer)local_40;
  pcVar2 = (name->_M_dataplus)._M_p;
  local_f0 = &this->name;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->instance_name,pcVar2,pcVar2 + name->_M_string_length);
  this->generator_id = -1;
  this->debug = false;
  (this->verilog_fn)._M_dataplus._M_p = (pointer)&(this->verilog_fn).field_2;
  (this->verilog_fn)._M_string_length = 0;
  (this->verilog_fn).field_2._M_local_buf[0] = '\0';
  (this->lib_files_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lib_files_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->lib_files_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->context_ = context;
  p_Var1 = &(this->vars_)._M_t._M_impl.super__Rb_tree_header;
  (this->vars_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->vars_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->vars_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->vars_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->vars_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->ports_)._M_t._M_impl.super__Rb_tree_header;
  (this->ports_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ports_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ports_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ports_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ports_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->params_)._M_t._M_impl.super__Rb_tree_header;
  (this->params_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->params_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->params_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->params_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->params_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->exprs_)._M_h._M_buckets = &(this->exprs_)._M_h._M_single_bucket;
  (this->exprs_)._M_h._M_bucket_count = 1;
  (this->exprs_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->exprs_)._M_h._M_element_count = 0;
  (this->exprs_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->exprs_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->exprs_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = &(this->port_bundle_mapping_)._M_t._M_impl.super__Rb_tree_header;
  (this->port_bundle_mapping_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->port_bundle_mapping_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->port_bundle_mapping_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->port_bundle_mapping_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->stmts_).
  super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->stmts_).
  super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->port_bundle_mapping_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->stmts_).
  super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->children_)._M_h._M_buckets = &(this->children_)._M_h._M_single_bucket;
  (this->children_)._M_h._M_bucket_count = 1;
  (this->children_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->children_)._M_h._M_element_count = 0;
  (this->children_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->children_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->children_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->children_names_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->children_names_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->children_names_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->children_debug_)._M_h._M_buckets = &(this->children_debug_)._M_h._M_single_bucket;
  (this->children_debug_)._M_h._M_bucket_count = 1;
  (this->children_debug_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->children_debug_)._M_h._M_element_count = 0;
  (this->children_debug_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->children_debug_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->children_debug_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->children_comments_)._M_h._M_buckets = &(this->children_comments_)._M_h._M_single_bucket;
  (this->children_comments_)._M_h._M_bucket_count = 1;
  (this->children_comments_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->children_comments_)._M_h._M_element_count = 0;
  (this->children_comments_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(undefined8 *)((long)&(this->children_comments_)._M_h._M_single_bucket + 2) = 0;
  *(undefined8 *)((long)&this->parent_generator_ + 2) = 0;
  (this->children_comments_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->children_comments_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->clones_)._M_h._M_buckets = &(this->clones_)._M_h._M_single_bucket;
  (this->clones_)._M_h._M_bucket_count = 1;
  (this->clones_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->clones_)._M_h._M_element_count = 0;
  (this->clones_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->clones_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->clones_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->is_cloned_ = false;
  this->has_instantiated_ = false;
  (this->named_blocks_)._M_h._M_buckets = &(this->named_blocks_)._M_h._M_single_bucket;
  (this->named_blocks_)._M_h._M_bucket_count = 1;
  (this->named_blocks_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->named_blocks_)._M_h._M_element_count = 0;
  (this->named_blocks_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->named_blocks_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->named_blocks_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = &(this->enums_)._M_t._M_impl.super__Rb_tree_header;
  (this->enums_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->enums_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->enums_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->enums_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->enums_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->fsms_)._M_t._M_impl.super__Rb_tree_header;
  (this->fsms_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->fsms_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->fsms_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->fsms_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->fsms_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->funcs_)._M_t._M_impl.super__Rb_tree_header;
  (this->funcs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->funcs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->funcs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->funcs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->funcs_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->func_index_)._M_t._M_impl.super__Rb_tree_header;
  (this->func_index_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->func_index_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->func_index_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->func_index_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->func_index_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->calls_)._M_t._M_impl.super__Rb_tree_header;
  (this->calls_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->calls_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->calls_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->calls_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->calls_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->def_instance_ = (Generator *)0x0;
  (this->auxiliary_vars_)._M_h._M_buckets = &(this->auxiliary_vars_)._M_h._M_single_bucket;
  (this->auxiliary_vars_)._M_h._M_bucket_count = 1;
  (this->auxiliary_vars_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->auxiliary_vars_)._M_h._M_element_count = 0;
  (this->auxiliary_vars_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->auxiliary_vars_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->auxiliary_vars_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = &(this->interfaces_)._M_t._M_impl.super__Rb_tree_header;
  (this->interfaces_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->interfaces_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->interfaces_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->interfaces_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->interfaces_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->properties_)._M_t._M_impl.super__Rb_tree_header;
  (this->properties_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->properties_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->properties_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->properties_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->properties_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->raw_package_imports_)._M_h._M_buckets = &(this->raw_package_imports_)._M_h._M_single_bucket
  ;
  (this->raw_package_imports_)._M_h._M_bucket_count = 1;
  (this->raw_package_imports_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->raw_package_imports_)._M_h._M_element_count = 0;
  (this->raw_package_imports_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  this->instantiation_stmt_ = (ModuleInstantiationStmt *)0x0;
  (this->raw_package_imports_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->raw_package_imports_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->stmts_remove_cache_)._M_h._M_buckets = &(this->stmts_remove_cache_)._M_h._M_single_bucket;
  (this->stmts_remove_cache_)._M_h._M_bucket_count = 1;
  (this->stmts_remove_cache_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->stmts_remove_cache_)._M_h._M_element_count = 0;
  (this->stmts_remove_cache_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->stmts_remove_cache_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->stmts_remove_cache_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->use_stmts_remove_cache_ = false;
  bVar3 = is_valid_variable_name(name);
  if (bVar3) {
    return;
  }
  this_00 = (UserException *)__cxa_allocate_exception(0x10);
  local_128 = (name->_M_dataplus)._M_p;
  sStack_120 = name->_M_string_length;
  format_str.size_ = 0xd;
  format_str.data_ = (char *)0x1e;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_128;
  fmt::v7::detail::vformat_abi_cxx11_
            (&local_110,(detail *)"{0} is a SystemVerilog keyword",format_str,args);
  UserException::UserException(this_00,&local_110);
  __cxa_throw(this_00,&UserException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Generator::Generator(kratos::Context *context, const std::string &name)
    : IRNode(IRNodeKind::GeneratorKind), name(name), instance_name(name), context_(context) {
    if (!is_valid_variable_name(name)) {
        throw UserException(::format("{0} is a SystemVerilog keyword", name));
    }
}